

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O2

wchar_t feat_order(wchar_t feat)

{
  wchar_t wVar1;
  
  wVar1 = f_info[feat].d_char;
  switch(wVar1) {
  case L' ':
    wVar1 = L'\a';
    break;
  case L'#':
    wVar1 = L'\x03';
    break;
  case L'%':
  case L'*':
    wVar1 = L'\x04';
    break;
  case L'\'':
  case L'+':
    wVar1 = L'\x01';
    break;
  case L'.':
    return L'\0';
  default:
    if ((uint)(wVar1 + L'\xffffffc6') < 2) {
      return L'\x05';
    }
    if ((wVar1 == L'<') || (wVar1 == L'>')) {
      return L'\x02';
    }
  case L'!':
  case L'\"':
  case L'$':
  case L'&':
  case L'(':
  case L')':
  case L',':
  case L'-':
    wVar1 = L'\x06';
  }
  return wVar1;
}

Assistant:

static int feat_order(int feat)
{
	struct feature *f = &f_info[feat];

	switch (f->d_char)
	{
		case L'.': 				return 0;
		case L'\'': case L'+': 	return 1;
		case L'<': case L'>':	return 2;
		case L'#':				return 3;
		case L'*': case L'%' :	return 4;
		case L';': case L':' :	return 5;
		case L' ':				return 7;
		default:
		{
			return 6;
		}
	}
}